

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hpdf_image_ccitt.c
# Opt level: O1

HPDF_STATUS
HPDF_Stream_CcittToStream
          (HPDF_BYTE *buf,HPDF_Stream dst,HPDF_Encrypt e,HPDF_UINT width,HPDF_UINT height,
          HPDF_UINT line_width,HPDF_BOOL top_is_first)

{
  uchar *bp;
  tidata_t ptVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  HPDF_Fax3CodecState *pHVar7;
  uint32 *puVar8;
  uchar *puVar9;
  HPDF_UINT HVar10;
  tableentry *tab;
  uint uVar11;
  HPDF_STATUS HVar12;
  HPDF_Fax3CodecState *esp;
  uint32 rowbytes;
  ulong uVar13;
  uint uVar14;
  uint bs;
  ulong uVar15;
  _HPDF_CCITT_Data data;
  uchar *local_88;
  _HPDF_CCITT_Data local_78;
  uchar *local_50;
  HPDF_UINT local_44;
  long local_40;
  HPDF_Fax3CodecState *local_38;
  
  HVar12 = 1;
  if (height != 0) {
    if (top_is_first == 0) {
      local_88 = buf + (height - 1) * line_width;
      uVar13 = -(ulong)line_width;
      HVar10 = -line_width;
    }
    else {
      uVar13 = (ulong)(height * line_width);
      HVar10 = line_width;
      local_88 = buf;
    }
    local_78.tif_data = (HPDF_Fax3CodecState *)0x0;
    local_78.tif_rawdatasize = 0;
    local_78.tif_rawcc = 0;
    local_78.tif_rawcp = (tidata_t)0x0;
    local_78.tif_rawdata = (tidata_t)0x0;
    local_78.dst = dst;
    local_78.tif_rawcp = (tidata_t)malloc(0x4000);
    local_78.tif_rawdatasize = 0x4000;
    local_78.tif_rawcc = 0;
    local_78.tif_rawdata = local_78.tif_rawcp;
    pHVar7 = (HPDF_Fax3CodecState *)malloc(0x80);
    if (pHVar7 != (HPDF_Fax3CodecState *)0x0) {
      (pHVar7->b).faxdcs = (char *)0x0;
      pHVar7->refline = (uchar *)0x0;
      pHVar7->runs = (uint32 *)0x0;
      (pHVar7->b).groupoptions = 0;
      (pHVar7->b).recvparams = 0;
      (pHVar7->b).subaddress = (char *)0x0;
      (pHVar7->b).rowbytes = line_width;
      (pHVar7->b).rowpixels = width;
      uVar14 = width * 2 + 0x3e & 0xffffffc0;
      local_78.tif_data = pHVar7;
      puVar8 = (uint32 *)malloc((ulong)(uVar14 * 2 + 6) << 2);
      pHVar7->runs = puVar8;
      HVar12 = 1;
      if (puVar8 != (uint32 *)0x0) {
        pHVar7->curruns = puVar8;
        pHVar7->refruns = puVar8 + (uVar14 | 3);
        puVar9 = (uchar *)malloc((ulong)line_width);
        pHVar7->refline = puVar9;
        if (puVar9 != (uchar *)0x0) {
          pHVar7->data = 0;
          pHVar7->bit = 8;
          if (pHVar7->refline != (uchar *)0x0) {
            memset(pHVar7->refline,0,(ulong)line_width);
          }
          pHVar7->k = 0;
          pHVar7->maxk = 0;
          pHVar7->line = 0;
          if (buf + uVar13 != local_88) {
            local_40 = (long)(int)HVar10;
            do {
              if (0 < (int)line_width) {
                local_38 = local_78.tif_data;
                pHVar7 = local_78.tif_data;
                puVar9 = local_88;
                HVar10 = line_width;
                do {
                  bp = pHVar7->refline;
                  uVar14 = (pHVar7->b).rowpixels;
                  uVar15 = 0;
                  uVar2 = 0;
                  local_44 = HVar10;
                  if (-1 < (char)*puVar9) {
                    uVar2 = find0span(puVar9,0,uVar14);
                  }
                  local_50 = puVar9;
                  if (-1 < (char)*bp) {
                    uVar3 = find0span(bp,0,uVar14);
                    uVar15 = (ulong)uVar3;
                  }
                  uVar3 = 0;
                  while( true ) {
                    bs = (uint)uVar15;
                    uVar11 = uVar14;
                    if (bs < uVar14) {
                      if ((bp[uVar15 >> 3] >> (~(byte)uVar15 & 7) & 1) == 0) {
                        iVar4 = find0span(bp,bs,uVar14);
                      }
                      else {
                        iVar4 = find1span(bp,bs,uVar14);
                      }
                      uVar11 = iVar4 + bs;
                    }
                    if (uVar11 < uVar2) {
                      HPDF_Fax3PutBits(&local_78,1,4);
                    }
                    else {
                      uVar11 = (bs - uVar2) + 3;
                      if (uVar11 < 7) {
                        HPDF_Fax3PutBits(&local_78,(uint)vcodes[uVar11].code,
                                         (uint)vcodes[uVar11].length);
                        uVar11 = uVar2;
                      }
                      else {
                        uVar11 = uVar14;
                        if (uVar2 < uVar14) {
                          if ((local_50[uVar2 >> 3] >> (~(byte)uVar2 & 7) & 1) == 0) {
                            iVar4 = find0span(local_50,uVar2,uVar14);
                          }
                          else {
                            iVar4 = find1span(local_50,uVar2,uVar14);
                          }
                          uVar11 = iVar4 + uVar2;
                        }
                        HPDF_Fax3PutBits(&local_78,1,3);
                        if ((uVar3 + uVar2 == 0) ||
                           ((local_50[uVar3 >> 3] >> (~(byte)uVar3 & 7) & 1) == 0)) {
                          putspan(&local_78,uVar2 - uVar3,HPDF_TIFFFaxWhiteCodes);
                          tab = HPDF_TIFFFaxBlackCodes;
                        }
                        else {
                          putspan(&local_78,uVar2 - uVar3,HPDF_TIFFFaxBlackCodes);
                          tab = HPDF_TIFFFaxWhiteCodes;
                        }
                        putspan(&local_78,uVar11 - uVar2,tab);
                      }
                    }
                    pHVar7 = local_38;
                    puVar9 = local_50;
                    if (uVar14 <= uVar11) break;
                    uVar2 = 1 << (~(byte)uVar11 & 7) & (uint)local_50[uVar11 >> 3];
                    if (uVar2 == 0) {
                      iVar4 = find0span(local_50,uVar11,uVar14);
                      iVar5 = find1span(bp,uVar11,uVar14);
                    }
                    else {
                      iVar4 = find1span(local_50,uVar11,uVar14);
                      iVar5 = find0span(bp,uVar11,uVar14);
                    }
                    iVar5 = iVar5 + uVar11;
                    if (uVar2 == 0) {
                      iVar6 = find0span(bp,iVar5,uVar14);
                    }
                    else {
                      iVar6 = find1span(bp,iVar5,uVar14);
                    }
                    uVar2 = iVar4 + uVar11;
                    uVar15 = (ulong)(uint)(iVar6 + iVar5);
                    uVar3 = uVar11;
                  }
                  memcpy(local_38->refline,local_50,(ulong)(local_38->b).rowbytes);
                  uVar14 = (pHVar7->b).rowbytes;
                  puVar9 = puVar9 + uVar14;
                  HVar10 = local_44 - uVar14;
                } while (0 < (int)HVar10);
              }
              local_88 = local_88 + local_40;
            } while (buf + uVar13 != local_88);
          }
          HPDF_Fax3PutBits(&local_78,1,0xc);
          HPDF_Fax3PutBits(&local_78,1,0xc);
          ptVar1 = local_78.tif_rawdata;
          if ((0 < local_78.tif_rawcc) &&
             (HVar12 = HPDF_Stream_Write(local_78.dst,local_78.tif_rawdata,local_78.tif_rawcc),
             HVar12 == 0)) {
            local_78._16_8_ = local_78._16_8_ & 0xffffffff;
            local_78.tif_rawcp = ptVar1;
          }
          HVar12 = 0;
        }
      }
      HPDF_FreeCCITTFax3(&local_78);
    }
  }
  return HVar12;
}

Assistant:

HPDF_STATUS 
HPDF_Stream_CcittToStream( const HPDF_BYTE   *buf,
                            HPDF_Stream  dst,
							HPDF_Encrypt  e,
							HPDF_UINT          width,
							HPDF_UINT          height,
							HPDF_UINT          line_width,
							HPDF_BOOL		   top_is_first)
{
	const HPDF_BYTE   *pBufPos;
	const HPDF_BYTE   *pBufEnd; /* end marker */
	int lineIncrement;
	struct _HPDF_CCITT_Data data;

	HPDF_UNUSED (e);

	if(height==0) return 1;
	if(top_is_first) {
		pBufPos = buf;
		pBufEnd=buf+(line_width*height);
		lineIncrement = line_width;
	} else {
		pBufPos = buf+(line_width*(height-1));
		pBufEnd= buf-line_width;
		lineIncrement = -((int)line_width);
	}	

	memset(&data, 0, sizeof(struct _HPDF_CCITT_Data));
	data.dst = dst;
	data.tif_rawdata = (tidata_t) malloc( 16384 ); /*  16 kb buffer */
	data.tif_rawdatasize = 16384;
	data.tif_rawcc = 0;
	data.tif_rawcp = data.tif_rawdata;

	if(HPDF_InitCCITTFax3(&data)!=HPDF_OK)
		return 1;

	if(HPDF_Fax3SetupState(&data, width, height, line_width)!=HPDF_OK)
	{
		HPDF_FreeCCITTFax3(&data);
		return 1;
	}

	if(HPDF_Fax3PreEncode(&data)!=HPDF_OK)
	{
		HPDF_FreeCCITTFax3(&data);
		return 1;
	}

	/*  encode data */
	while(pBufEnd!=pBufPos)
	{
		HPDF_Fax4Encode(&data, (tidata_t)pBufPos, line_width);
		pBufPos+=lineIncrement;
	}

	HPDF_Fax4PostEncode(&data);

	HPDF_FreeCCITTFax3(&data);

	return HPDF_OK;
}